

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O2

_Bool ppc_cpu_exec_interrupt_ppc64(CPUState *cs,int interrupt_request)

{
  byte *pbVar1;
  uint uVar2;
  TranslationBlock *pTVar3;
  byte bVar4;
  _Bool _Var5;
  char cVar6;
  int excp;
  int excp_model;
  
  if ((interrupt_request & 2U) == 0) goto LAB_009d9a98;
  uVar2 = *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec);
  if ((uVar2 & 1) == 0) {
    if ((uVar2 & 4) != 0) {
      *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffffffa;
      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
      excp = 1;
      goto LAB_009d9a84;
    }
    pTVar3 = cs[1].tb_jmp_cache[0x3a9];
    cVar6 = '\x01';
    if (-1 < (short)pTVar3) {
      cVar6 = *(char *)((long)cs[3].tb_jmp_cache + 0x4a5a);
    }
    bVar4 = (byte)((ulong)pTVar3 >> 0x38);
    if ((uVar2 >> 9 & 1) != 0) {
      if (cVar6 == '\0') {
        if ((bVar4 >> 4 & 1) == 0 && ((ulong)cs[1].tb_jmp_cache[0x5fa] & 1) != 0) goto LAB_009d9af0;
      }
      else if (((ulong)cs[1].tb_jmp_cache[0x5fa] & 1) != 0) {
LAB_009d9af0:
        *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffffdfa;
        excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
        excp = 0x43;
        goto LAB_009d9a84;
      }
    }
    if ((uVar2 >> 0x12 & 1) != 0) {
      if (cVar6 == '\0') {
        if ((bVar4 >> 4 & 1) == 0 && ((ulong)cs[1].tb_jmp_cache[0x5fa] & 2) != 0) goto LAB_009d9b36;
      }
      else if (((ulong)cs[1].tb_jmp_cache[0x5fa] & 2) != 0) {
LAB_009d9b36:
        excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
        excp = 0x65;
        goto LAB_009d9a84;
      }
    }
    if (((uVar2 & 8) != 0) &&
       (((cVar6 != '\0' &&
         (((ulong)pTVar3 & 0x1000000000004000) != 0x1000000000000000 ||
          ((ulong)cs[1].tb_jmp_cache[0x5fa] & 0x10) == 0)) ||
        ((*(char *)((long)cs[3].tb_jmp_cache + 0x4a59) == '\x01' &&
         (((ulong)pTVar3 & 0x1000000000000000) == 0 && ((ulong)cs[1].tb_jmp_cache[0x5fa] & 8) == 0))
        )))) {
      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
      excp = 4;
      goto LAB_009d9a84;
    }
    if ((uVar2 & 0x20) != 0 && ((uint)pTVar3 >> 0x11 & 1) != 0) {
      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
      excp = 0;
      goto LAB_009d9a84;
    }
    if (cVar6 != '\0') {
      if ((uVar2 >> 0xc & 1) == 0) {
        if ((uVar2 >> 0xd & 1) == 0) {
          if ((uVar2 >> 0xb & 1) == 0) {
            if ((uVar2 >> 10 & 1) == 0) {
              if ((uVar2 >> 8 & 1) == 0) {
                if ((uVar2 >> 0xe & 1) == 0) {
                  if ((uVar2 >> 0x11 & 1) == 0) {
                    if ((short)uVar2 < 0) {
                      *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffd02fa;
                      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                      excp = 0x55;
                    }
                    else {
                      if (-1 < (char)uVar2) goto LAB_009d9a3d;
                      *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffd027a;
                      excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                      excp = 0x56;
                    }
                  }
                  else {
                    *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffd82fa;
                    excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                    excp = 100;
                  }
                }
                else {
                  *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffff82fa;
                  excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                  if ((*(byte *)((long)cs[3].tb_jmp_cache + 0x46dd) & 0x20) == 0) {
                    excp = 0x24;
                  }
                  else {
                    excp = 99;
                  }
                }
              }
              else {
                _Var5 = ppc_decr_clear_on_delivery_ppc64
                                  ((CPUPPCState_conflict2 *)(cs[1].tb_jmp_cache + 0x359));
                if (_Var5) {
                  pbVar1 = (byte *)((long)cs[3].tb_jmp_cache + 0x46ed);
                  *pbVar1 = *pbVar1 & 0xfe;
                }
                excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
                excp = 10;
              }
            }
            else {
              *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffffc3fa;
              excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
              excp = 0x4a;
            }
          }
          else {
            *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffffc7fa;
            excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
            excp = 0xb;
          }
        }
        else {
          *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffffcffa;
          excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
          excp = 0x25;
        }
      }
      else {
        *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xffffeffa;
        excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
        excp = 0xc;
      }
      goto LAB_009d9a84;
    }
LAB_009d9a3d:
    if (*(char *)((long)cs[3].tb_jmp_cache + 0x4a5a) == '\x01') {
      cpu_abort_ppc64(cs,"Wakeup from PM state but interrupt Undelivered");
    }
  }
  else {
    *(uint *)((long)cs[3].tb_jmp_cache + 0x46ec) = uVar2 & 0xfffffffe;
    excp_model = *(int *)((long)cs[3].tb_jmp_cache + 0x46c4);
    excp = 0x40;
LAB_009d9a84:
    powerpc_excp((PowerPCCPU_conflict3 *)cs,excp_model,excp);
  }
  if (*(int *)((long)cs[3].tb_jmp_cache + 0x46ec) == 0) {
    *(byte *)&cs->interrupt_request = (byte)cs->interrupt_request & 0xfd;
  }
LAB_009d9a98:
  return SUB41((interrupt_request & 2U) >> 1,0);
}

Assistant:

bool ppc_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    PowerPCCPU *cpu = POWERPC_CPU(cs);
    CPUPPCState *env = &cpu->env;

    if (interrupt_request & CPU_INTERRUPT_HARD) {
        ppc_hw_interrupt(env);
        if (env->pending_interrupts == 0) {
            cs->interrupt_request &= ~CPU_INTERRUPT_HARD;
        }
        return true;
    }
    return false;
}